

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O1

void __thiscall
DRAG<UF>::PerformLabelingMem
          (DRAG<UF> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  char cVar2;
  char cVar3;
  undefined4 uVar4;
  Mat1b *pMVar5;
  long lVar6;
  long lVar7;
  pointer puVar8;
  pointer puVar9;
  pointer piVar10;
  DRAG<UF> *pDVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  double dVar29;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  undefined1 local_2e0 [104];
  Mat local_278 [16];
  long local_268;
  long *local_230;
  long local_218;
  pointer local_210;
  DRAG<UF> *local_208;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  undefined1 local_1d8 [104];
  Mat local_170 [16];
  long local_160;
  long *local_128;
  Size local_110;
  undefined1 local_108 [8];
  void *pvStack_100;
  Size local_f8;
  undefined4 local_a8;
  Mat *local_a0;
  undefined8 local_98;
  Mat local_90 [96];
  
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat((MemMat<unsigned_char> *)local_1d8,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar17 = **(ulong **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_110 = (Size)(uVar17 << 0x20 | uVar17 >> 0x20);
  MemMat<int>::MemMat((MemMat<int> *)local_2e0,&local_110,0);
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar21 = *(int *)&pMVar5->field_0x8;
  iVar13 = *(int *)&pMVar5->field_0xc;
  local_200 = accesses;
  UF::MemAlloc(((iVar13 - (iVar13 + 1 >> 0x1f)) + 1 >> 1) *
               ((iVar21 - (iVar21 + 1 >> 0x1f)) + 1 >> 1) + 1);
  piVar10 = UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_210 = UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  *UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
   super__Vector_impl_data._M_start =
       *UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start + 1;
  puVar9 = UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  UF::length_ = 1;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar15 = *(uint *)&pMVar5->field_0x8;
  iVar21 = *(int *)&pMVar5->field_0xc;
  if (0 < iVar21) {
    iVar13 = 0;
    do {
      lVar24 = (long)iVar13;
      piVar1 = (int *)(local_160 + lVar24 * 4);
      *piVar1 = *piVar1 + 1;
      uVar14 = UF::length_;
      if (*(char *)(local_1d8._24_8_ + lVar24) != '\0') {
        lVar22 = (long)(int)UF::length_;
        piVar10[lVar22] = piVar10[lVar22] + 1;
        puVar9[lVar22] = uVar14;
        uVar14 = UF::length_;
        UF::length_ = UF::length_ + 1;
        piVar1 = (int *)(local_268 + lVar24 * 4);
        *piVar1 = *piVar1 + 1;
        *(uint *)(local_2e0._24_8_ + lVar24 * 4) = uVar14;
        lVar24 = lVar24 + 1;
        if (iVar21 <= (int)lVar24) break;
        lVar22 = 0;
        while( true ) {
          piVar1 = (int *)(local_160 + lVar24 * 4 + lVar22 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(local_1d8._24_8_ + lVar24 + lVar22) == '\0') break;
          lVar16 = (long)(iVar13 + (int)lVar22);
          piVar1 = (int *)(local_268 + lVar16 * 4);
          *piVar1 = *piVar1 + 1;
          uVar4 = *(undefined4 *)(local_2e0._24_8_ + lVar16 * 4);
          piVar1 = (int *)(local_268 + lVar24 * 4 + lVar22 * 4);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2e0._24_8_ + lVar24 * 4 + lVar22 * 4) = uVar4;
          lVar22 = lVar22 + 1;
          if ((1 - iVar21) + iVar13 + (int)lVar22 == 0) goto LAB_00115b24;
        }
        iVar13 = iVar13 + (int)lVar22 + 1;
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 < iVar21);
  }
LAB_00115b24:
  local_208 = this;
  if (1 < (int)uVar15) {
    iVar21 = iVar21 + -1;
    local_210 = (pointer)(long)iVar21;
    local_1e8 = (long)local_210 + -1;
    local_1f0 = -(long)local_210;
    uVar17 = 1;
    lVar24 = 0;
    do {
      if (iVar21 == 0) {
        lVar22 = *local_128;
        piVar1 = (int *)(local_160 + lVar22 * uVar17);
        *piVar1 = *piVar1 + 1;
        lVar16 = *(long *)local_1d8._80_8_;
        if (*(char *)(local_1d8._24_8_ + lVar16 * uVar17) != '\0') {
          lVar23 = uVar17 - 1;
          piVar1 = (int *)(local_160 + lVar22 * lVar23);
          *piVar1 = *piVar1 + 1;
          uVar14 = UF::length_;
          if (*(char *)(local_1d8._24_8_ + lVar16 * lVar23) == '\0') {
            lVar22 = (long)(int)UF::length_;
            UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar22] =
                 UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar22] + 1;
            UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar22] = uVar14;
            uVar14 = UF::length_;
            UF::length_ = UF::length_ + 1;
            piVar1 = (int *)(local_268 + *local_230 * uVar17);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2e0._24_8_ + *(long *)local_2e0._80_8_ * uVar17) = uVar14;
          }
          else {
            lVar22 = *local_230;
            piVar1 = (int *)(local_268 + lVar22 * lVar23);
            *piVar1 = *piVar1 + 1;
            lVar16 = *(long *)local_2e0._80_8_;
            uVar4 = *(undefined4 *)(local_2e0._24_8_ + lVar23 * lVar16);
            piVar1 = (int *)(local_268 + lVar22 * uVar17);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(local_2e0._24_8_ + lVar16 * uVar17) = uVar4;
          }
        }
      }
      else {
        lVar22 = *local_128;
        piVar1 = (int *)(local_160 + lVar22 * uVar17);
        *piVar1 = *piVar1 + 1;
        lVar16 = *(long *)local_1d8._80_8_;
        if (*(char *)(local_1d8._24_8_ + lVar16 * uVar17) == '\0') {
          uVar25 = 0;
          goto LAB_00115cb8;
        }
        lVar23 = uVar17 - 1;
        lVar22 = lVar22 * lVar23;
        piVar1 = (int *)(local_160 + lVar22);
        *piVar1 = *piVar1 + 1;
        lVar16 = lVar16 * lVar23;
        if (*(char *)(local_1d8._24_8_ + lVar16) == '\0') {
          piVar1 = (int *)(local_160 + 4 + lVar22);
          *piVar1 = *piVar1 + 1;
          uVar14 = UF::length_;
          if (*(char *)(local_1d8._24_8_ + 1 + lVar16) == '\0') {
            lVar22 = (long)(int)UF::length_;
            UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar22] =
                 UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar22] + 1;
            UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar22] = uVar14;
            uVar14 = UF::length_;
            UF::length_ = UF::length_ + 1;
            piVar1 = (int *)(local_268 + *local_230 * uVar17);
            *piVar1 = *piVar1 + 1;
            *(uint *)(local_2e0._24_8_ + *(long *)local_2e0._80_8_ * uVar17) = uVar14;
            iVar13 = 0;
            goto LAB_001162a0;
          }
          lVar22 = *local_230;
          piVar1 = (int *)(local_268 + 4 + lVar22 * lVar23);
          *piVar1 = *piVar1 + 1;
          lVar16 = *(long *)local_2e0._80_8_;
          uVar4 = *(undefined4 *)(local_2e0._24_8_ + 4 + lVar23 * lVar16);
          piVar1 = (int *)(local_268 + lVar22 * uVar17);
          *piVar1 = *piVar1 + 1;
          *(undefined4 *)(local_2e0._24_8_ + lVar16 * uVar17) = uVar4;
          uVar25 = 0;
          goto LAB_0011651b;
        }
        lVar22 = *local_230;
        piVar1 = (int *)(local_268 + lVar22 * lVar23);
        *piVar1 = *piVar1 + 1;
        lVar16 = *(long *)local_2e0._80_8_;
        uVar4 = *(undefined4 *)(local_2e0._24_8_ + lVar23 * lVar16);
        piVar1 = (int *)(local_268 + lVar22 * uVar17);
        *piVar1 = *piVar1 + 1;
        *(undefined4 *)(local_2e0._24_8_ + lVar16 * uVar17) = uVar4;
        uVar25 = 0;
LAB_001165bd:
        iVar13 = (int)uVar25;
        iVar19 = iVar13 + 1;
        if (iVar19 < iVar21) {
          lVar16 = *local_128;
          lVar23 = *(long *)local_1d8._80_8_;
          local_1f8 = uVar17 - 1;
          local_218 = lVar16 * local_1f8 + local_160;
          local_1e0 = lVar23 * local_1f8 + local_1d8._24_8_;
          lVar27 = (long)iVar13;
          lVar22 = local_2e0._24_8_ + 4 + lVar27 * 4;
          lVar18 = local_268 + lVar27 * 4 + 4;
          lVar26 = 0;
          while( true ) {
            piVar1 = (int *)(lVar16 * uVar17 + lVar27 * 4 + local_160 + 4 + lVar26 * 4);
            *piVar1 = *piVar1 + 1;
            iVar19 = (int)(lVar27 + 1);
            if (*(char *)(lVar23 * uVar17 + lVar27 + local_1d8._24_8_ + 1 + lVar26) == '\0') {
              uVar25 = (ulong)(uint)(iVar19 + (int)lVar26);
              goto LAB_00115cb8;
            }
            piVar1 = (int *)(local_160 + lVar16 * lVar24 + lVar27 * 4 + 4 + lVar26 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(local_1d8._24_8_ + lVar23 * lVar24 + lVar27 + 1 + lVar26) == '\0') break;
            lVar28 = *local_230;
            piVar1 = (int *)(lVar24 * lVar28 + lVar18 + lVar26 * 4);
            *piVar1 = *piVar1 + 1;
            lVar20 = *(long *)local_2e0._80_8_;
            uVar4 = *(undefined4 *)(lVar24 * lVar20 + lVar22 + lVar26 * 4);
            piVar1 = (int *)(lVar28 * uVar17 + lVar18 + lVar26 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar20 * uVar17 + lVar22 + lVar26 * 4) = uVar4;
            lVar26 = lVar26 + 1;
            if (local_1f0 + lVar27 + 1 + lVar26 == 0) {
              iVar13 = iVar13 + (int)lVar26;
              iVar19 = iVar19 + (int)lVar26;
              goto LAB_00116732;
            }
          }
          iVar19 = iVar13 + (int)lVar26;
          lVar16 = (long)(iVar19 + 2);
          piVar1 = (int *)(local_218 + lVar16 * 4);
          *piVar1 = *piVar1 + 1;
          uVar25 = lVar27 + 1 + lVar26;
          iVar13 = (int)uVar25;
          lVar22 = (long)iVar19;
          if (*(char *)(local_1e0 + lVar16) == '\0') {
            lVar16 = *local_230 * uVar17 + local_268;
            piVar1 = (int *)(lVar16 + lVar22 * 4);
            *piVar1 = *piVar1 + 1;
            lVar23 = *(long *)local_2e0._80_8_ * uVar17 + local_2e0._24_8_;
            uVar4 = *(undefined4 *)(lVar23 + lVar22 * 4);
            piVar1 = (int *)(lVar16 + lVar27 * 4 + 4 + lVar26 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar23 + lVar27 * 4 + 4 + lVar26 * 4) = uVar4;
            goto LAB_001162a0;
          }
          lVar23 = *local_230;
          piVar1 = (int *)(lVar23 * uVar17 + local_268 + lVar22 * 4);
          *piVar1 = *piVar1 + 1;
          lVar18 = *(long *)local_2e0._80_8_;
          uVar14 = *(uint *)(lVar18 * uVar17 + local_2e0._24_8_ + lVar22 * 4);
          piVar1 = (int *)(lVar23 * local_1f8 + local_268 + lVar16 * 4);
          *piVar1 = *piVar1 + 1;
          uVar14 = UF::MemMerge(uVar14,*(uint *)(lVar18 * local_1f8 + local_2e0._24_8_ + lVar16 * 4)
                               );
          piVar1 = (int *)(*local_230 * uVar17 + local_268 + lVar27 * 4 + 4 + lVar26 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(*(long *)local_2e0._80_8_ * uVar17 + local_2e0._24_8_ + lVar27 * 4 + 4 +
                   lVar26 * 4) = uVar14;
LAB_0011651b:
          do {
            lVar22 = (long)(int)uVar25;
            piVar1 = (int *)(*local_128 * uVar17 + local_160 + 4 + lVar22 * 4);
            *piVar1 = *piVar1 + 1;
            uVar25 = lVar22 + 1;
            cVar3 = *(char *)(lVar22 + 1 + *(long *)local_1d8._80_8_ * uVar17 + local_1d8._24_8_);
            if (iVar21 <= (int)uVar25) {
              if (cVar3 != '\0') {
                lVar16 = *local_230;
                piVar1 = (int *)(lVar16 * (uVar17 - 1) + local_268 + 4 + lVar22 * 4);
                *piVar1 = *piVar1 + 1;
                lVar23 = *(long *)local_2e0._80_8_;
                uVar4 = *(undefined4 *)((uVar17 - 1) * lVar23 + local_2e0._24_8_ + 4 + lVar22 * 4);
                piVar1 = (int *)(lVar16 * uVar17 + local_268 + 4 + lVar22 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar23 * uVar17 + local_2e0._24_8_ + 4 + lVar22 * 4) = uVar4;
              }
              goto LAB_00116982;
            }
            if (cVar3 != '\0') {
              lVar16 = *local_230;
              piVar1 = (int *)(lVar16 * (uVar17 - 1) + local_268 + 4 + lVar22 * 4);
              *piVar1 = *piVar1 + 1;
              lVar23 = *(long *)local_2e0._80_8_;
              uVar4 = *(undefined4 *)((uVar17 - 1) * lVar23 + local_2e0._24_8_ + 4 + lVar22 * 4);
              piVar1 = (int *)(lVar16 * uVar17 + local_268 + 4 + lVar22 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar23 * uVar17 + local_2e0._24_8_ + 4 + lVar22 * 4) = uVar4;
              goto LAB_001165bd;
            }
LAB_00115cb8:
            while( true ) {
              lVar18 = (long)(int)uVar25;
              lVar22 = local_160 + lVar18 * 4;
              lVar16 = lVar18 << 0x20;
              lVar23 = 0;
              do {
                lVar26 = lVar16;
                lVar27 = lVar26 >> 0x20;
                if ((long)local_210 <= lVar18 + lVar23 + 1) {
                  lVar22 = *local_128;
                  lVar23 = lVar26 + 0x100000000 >> 0x20;
                  piVar1 = (int *)((lVar26 + 0x100000000 >> 0x1e) + lVar22 * uVar17 + local_160);
                  *piVar1 = *piVar1 + 1;
                  lVar16 = *(long *)local_1d8._80_8_;
                  if (*(char *)(lVar23 + lVar16 * uVar17 + local_1d8._24_8_) != '\0') {
                    lVar18 = uVar17 - 1;
                    lVar22 = local_160 + lVar22 * lVar18;
                    piVar1 = (int *)(lVar22 + lVar23 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar16 = local_1d8._24_8_ + lVar16 * lVar18;
                    if (*(char *)(lVar23 + lVar16) == '\0') {
                      piVar1 = (int *)(lVar22 + (lVar26 >> 0x1e));
                      *piVar1 = *piVar1 + 1;
                      uVar14 = UF::length_;
                      if (*(char *)(lVar16 + lVar27) == '\0') {
                        lVar22 = (long)(int)UF::length_;
                        UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar22] =
                             UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start[lVar22] + 1;
                        UF::mem_P_.vec_.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar22] = uVar14;
                        uVar14 = UF::length_;
                        UF::length_ = UF::length_ + 1;
                        piVar1 = (int *)(*local_230 * uVar17 + local_268 + lVar23 * 4);
                        *piVar1 = *piVar1 + 1;
                        *(uint *)(*(long *)local_2e0._80_8_ * uVar17 + local_2e0._24_8_ + lVar23 * 4
                                 ) = uVar14;
                      }
                      else {
                        lVar22 = *local_230;
                        piVar1 = (int *)(lVar22 * lVar18 + local_268 + lVar27 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar16 = *(long *)local_2e0._80_8_;
                        uVar4 = *(undefined4 *)(lVar18 * lVar16 + local_2e0._24_8_ + lVar27 * 4);
                        piVar1 = (int *)(lVar22 * uVar17 + local_268 + lVar23 * 4);
                        *piVar1 = *piVar1 + 1;
                        *(undefined4 *)(lVar16 * uVar17 + local_2e0._24_8_ + lVar23 * 4) = uVar4;
                      }
                    }
                    else {
                      lVar22 = *local_230;
                      piVar1 = (int *)(lVar22 * lVar18 + local_268 + lVar23 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar16 = *(long *)local_2e0._80_8_;
                      uVar4 = *(undefined4 *)(lVar18 * lVar16 + local_2e0._24_8_ + lVar23 * 4);
                      piVar1 = (int *)(lVar22 * uVar17 + local_268 + lVar23 * 4);
                      *piVar1 = *piVar1 + 1;
                      *(undefined4 *)(lVar16 * uVar17 + local_2e0._24_8_ + lVar23 * 4) = uVar4;
                    }
                  }
                  goto LAB_00116982;
                }
                lVar6 = *local_128;
                piVar1 = (int *)(uVar17 * lVar6 + lVar22 + 4 + lVar23 * 4);
                *piVar1 = *piVar1 + 1;
                lVar7 = *(long *)local_1d8._80_8_;
                lVar28 = lVar23 + 1;
                lVar20 = lVar23 + 1;
                lVar16 = lVar26 + 0x100000000;
                lVar23 = lVar28;
              } while (*(char *)(lVar20 + uVar17 * lVar7 + local_1d8._24_8_ + lVar18) == '\0');
              uVar25 = (uVar25 & 0xffffffff) + lVar28;
              piVar1 = (int *)(lVar22 + lVar24 * lVar6 + lVar28 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar28 + local_1d8._24_8_ + lVar18 + lVar24 * lVar7) != '\0') {
                lVar22 = *local_230;
                piVar1 = (int *)(lVar22 * lVar24 + local_268 + lVar18 * 4 + lVar28 * 4);
                *piVar1 = *piVar1 + 1;
                lVar16 = *(long *)local_2e0._80_8_;
                uVar4 = *(undefined4 *)
                         (lVar16 * lVar24 + local_2e0._24_8_ + lVar18 * 4 + lVar28 * 4);
                piVar1 = (int *)(lVar22 * uVar17 + local_268 + lVar18 * 4 + lVar28 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar16 * uVar17 + local_2e0._24_8_ + lVar18 * 4 + lVar28 * 4) =
                     uVar4;
                goto LAB_001165bd;
              }
              lVar22 = uVar17 - 1;
              lVar23 = local_160 + lVar6 * lVar22;
              lVar16 = local_1d8._24_8_ + lVar7 * lVar22;
              piVar1 = (int *)(lVar23 + (lVar26 + 0x200000000 >> 0x1e));
              *piVar1 = *piVar1 + 1;
              lVar20 = lVar26 + 0x200000000 >> 0x20;
              cVar3 = *(char *)(lVar16 + lVar20);
              piVar1 = (int *)(lVar23 + (lVar26 >> 0x1e));
              *piVar1 = *piVar1 + 1;
              uVar14 = UF::length_;
              cVar2 = *(char *)(lVar16 + lVar27);
              if (cVar3 != '\0') break;
              if (cVar2 == '\0') {
                lVar22 = (long)(int)UF::length_;
                UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar22] =
                     UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar22] + 1;
                UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar22] = uVar14;
                uVar14 = UF::length_;
                UF::length_ = UF::length_ + 1;
                piVar1 = (int *)(*local_230 * uVar17 + local_268 + lVar18 * 4 + lVar28 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)local_2e0._80_8_ * uVar17 + local_2e0._24_8_ + lVar18 * 4 +
                         lVar28 * 4) = uVar14;
              }
              else {
                lVar16 = *local_230;
                piVar1 = (int *)(lVar16 * lVar22 + local_268 + lVar27 * 4);
                *piVar1 = *piVar1 + 1;
                lVar23 = *(long *)local_2e0._80_8_;
                uVar4 = *(undefined4 *)(lVar22 * lVar23 + local_2e0._24_8_ + lVar27 * 4);
                piVar1 = (int *)(lVar16 * uVar17 + local_268 + lVar18 * 4 + lVar28 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar23 * uVar17 + local_2e0._24_8_ + lVar18 * 4 + lVar28 * 4) =
                     uVar4;
              }
              iVar13 = (int)uVar25;
LAB_001162a0:
              iVar19 = iVar13 + 1;
              if (iVar21 <= iVar19) {
LAB_001163ec:
                lVar22 = (long)iVar19;
                piVar1 = (int *)(*local_128 * uVar17 + local_160 + lVar22 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar22 + *(long *)local_1d8._80_8_ * uVar17 + local_1d8._24_8_) ==
                    '\0') goto LAB_00116982;
                lVar16 = *local_230 * uVar17 + local_268;
                goto LAB_00116965;
              }
              lVar22 = *local_128;
              lVar16 = *(long *)local_1d8._80_8_;
              lVar18 = (long)iVar13;
              iVar19 = iVar13 + 1;
              lVar23 = lVar18 << 0x20;
              lVar26 = 0;
              while( true ) {
                piVar1 = (int *)(local_160 + lVar22 * uVar17 + lVar18 * 4 + 4 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                local_218 = lVar18;
                if (*(char *)(local_1d8._24_8_ + lVar16 * uVar17 + lVar18 + 1 + lVar26) == '\0')
                break;
                piVar1 = (int *)(lVar22 * lVar24 + lVar18 * 4 + local_160 + 8 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar16 * lVar24 + lVar18 + local_1d8._24_8_ + 2 + lVar26) != '\0') {
                  lVar22 = *local_230;
                  piVar1 = (int *)((lVar23 >> 0x1e) + lVar22 * uVar17 + local_268);
                  *piVar1 = *piVar1 + 1;
                  lVar16 = *(long *)local_2e0._80_8_;
                  uVar14 = *(uint *)((lVar23 >> 0x1e) + lVar16 * uVar17 + local_2e0._24_8_);
                  piVar1 = (int *)(lVar22 * lVar24 + local_268 + lVar18 * 4 + 8 + lVar26 * 4);
                  *piVar1 = *piVar1 + 1;
                  uVar14 = UF::MemMerge(uVar14,*(uint *)(lVar16 * lVar24 + local_2e0._24_8_ +
                                                         lVar18 * 4 + 8 + lVar26 * 4));
                  piVar1 = (int *)(*local_230 * uVar17 + local_268 + lVar18 * 4 + 4 + lVar26 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(*(long *)local_2e0._80_8_ * uVar17 + local_2e0._24_8_ + lVar18 * 4 + 4 +
                           lVar26 * 4) = uVar14;
                  uVar25 = (ulong)(uint)(iVar19 + (int)lVar26);
                  goto LAB_0011651b;
                }
                lVar28 = *local_230 * uVar17 + local_268 + lVar18 * 4 + 4;
                piVar1 = (int *)(lVar28 + -4 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                lVar27 = *(long *)local_2e0._80_8_ * uVar17 + local_2e0._24_8_ + lVar18 * 4 + 4;
                uVar4 = *(undefined4 *)(lVar27 + -4 + lVar26 * 4);
                piVar1 = (int *)(lVar28 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar27 + lVar26 * 4) = uVar4;
                lVar23 = lVar23 + 0x100000000;
                lVar26 = lVar26 + 1;
                if (local_1e8 - lVar18 == lVar26) {
                  iVar13 = iVar13 + (int)lVar26;
                  iVar19 = iVar19 + (int)lVar26;
                  goto LAB_001163ec;
                }
              }
              uVar25 = (ulong)(uint)(iVar19 + (int)lVar26);
            }
            if (cVar2 == '\0') {
              lVar16 = *local_230;
              piVar1 = (int *)(lVar16 * lVar22 + local_268 + lVar20 * 4);
              *piVar1 = *piVar1 + 1;
              lVar23 = *(long *)local_2e0._80_8_;
              uVar4 = *(undefined4 *)(lVar22 * lVar23 + local_2e0._24_8_ + lVar20 * 4);
              piVar1 = (int *)(lVar16 * uVar17 + local_268 + lVar18 * 4 + lVar28 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar23 * uVar17 + local_2e0._24_8_ + lVar18 * 4 + lVar28 * 4) = uVar4;
            }
            else {
              lVar16 = *local_230 * lVar22 + local_268;
              piVar1 = (int *)(lVar16 + lVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar22 = lVar22 * *(long *)local_2e0._80_8_ + local_2e0._24_8_;
              uVar14 = *(uint *)(lVar22 + lVar27 * 4);
              piVar1 = (int *)(lVar16 + lVar20 * 4);
              *piVar1 = *piVar1 + 1;
              uVar14 = UF::MemMerge(uVar14,*(uint *)(lVar22 + lVar20 * 4));
              piVar1 = (int *)(*local_230 * uVar17 + local_268 + lVar18 * 4 + lVar28 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(*(long *)local_2e0._80_8_ * uVar17 + local_2e0._24_8_ + lVar18 * 4 +
                       lVar28 * 4) = uVar14;
            }
            uVar25 = uVar25 & 0xffffffff;
          } while( true );
        }
LAB_00116732:
        lVar16 = *local_128;
        lVar22 = (long)iVar19;
        piVar1 = (int *)(lVar16 * uVar17 + local_160 + lVar22 * 4);
        *piVar1 = *piVar1 + 1;
        lVar23 = *(long *)local_1d8._80_8_;
        if (*(char *)(lVar22 + lVar23 * uVar17 + local_1d8._24_8_) != '\0') {
          lVar18 = uVar17 - 1;
          piVar1 = (int *)(local_160 + lVar16 * lVar18 + lVar22 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar22 + local_1d8._24_8_ + lVar23 * lVar18) == '\0') {
            lVar16 = *local_230 * uVar17 + local_268;
LAB_00116965:
            piVar1 = (int *)(lVar16 + (long)iVar13 * 4);
            *piVar1 = *piVar1 + 1;
            lVar23 = *(long *)local_2e0._80_8_ * uVar17 + local_2e0._24_8_;
            uVar4 = *(undefined4 *)(lVar23 + (long)iVar13 * 4);
            piVar1 = (int *)(lVar16 + lVar22 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar23 + lVar22 * 4) = uVar4;
          }
          else {
            lVar16 = *local_230;
            piVar1 = (int *)(lVar16 * lVar18 + local_268 + lVar22 * 4);
            *piVar1 = *piVar1 + 1;
            lVar23 = *(long *)local_2e0._80_8_;
            uVar4 = *(undefined4 *)(lVar18 * lVar23 + local_2e0._24_8_ + lVar22 * 4);
            piVar1 = (int *)(lVar16 * uVar17 + local_268 + lVar22 * 4);
            *piVar1 = *piVar1 + 1;
            *(undefined4 *)(lVar23 * uVar17 + local_2e0._24_8_ + lVar22 * 4) = uVar4;
          }
        }
      }
LAB_00116982:
      uVar17 = uVar17 + 1;
      lVar24 = lVar24 + 1;
    } while (uVar17 != uVar15);
  }
  uVar15 = UF::MemFlatten();
  (local_208->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar15;
  piVar10 = UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar9 = UF::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)local_2e0._0_4_) {
    lVar24 = 0;
    do {
      if (0 < (int)local_2e0._4_4_) {
        lVar16 = *local_230 * lVar24 + local_268;
        lVar23 = *(long *)local_2e0._80_8_ * lVar24 + local_2e0._24_8_;
        lVar22 = 0;
        do {
          piVar1 = (int *)(lVar16 + lVar22 * 4);
          *piVar1 = *piVar1 + 1;
          iVar21 = *(int *)(lVar23 + lVar22 * 4);
          piVar10[iVar21] = piVar10[iVar21] + 1;
          uVar15 = puVar9[iVar21];
          piVar1 = (int *)(lVar16 + lVar22 * 4);
          *piVar1 = *piVar1 + 1;
          *(uint *)(lVar23 + lVar22 * 4) = uVar15;
          lVar22 = lVar22 + 1;
        } while (lVar22 < (int)local_2e0._4_4_);
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < (int)local_2e0._0_4_);
  }
  local_108 = (undefined1  [8])0x0;
  pvStack_100 = (void *)0x0;
  local_f8.width = 0;
  local_f8.height = 0;
  local_108 = (undefined1  [8])operator_new(0x20);
  pvVar12 = local_200;
  pvStack_100 = (void *)((long)local_108 + 0x20);
  *(undefined8 *)((long)local_108 + 0x10) = 0;
  *(undefined8 *)((long)local_108 + 0x18) = 0;
  *(undefined8 *)local_108 = 0;
  *(undefined8 *)((long)local_108 + 8) = 0;
  local_f8 = (Size)pvStack_100;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign(local_200,local_108);
  pDVar11 = local_208;
  if (local_108 != (undefined1  [8])0x0) {
    operator_delete((void *)local_108,(long)local_f8 - (long)local_108);
  }
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_170;
  cv::sum((_InputArray *)local_108);
  *(pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start =
       (long)((double)local_108 - 9.223372036854776e+18) & (long)(double)local_108 >> 0x3f |
       (long)(double)local_108;
  local_98 = 0;
  local_a8 = 0x81010004;
  local_a0 = local_278;
  cv::sum((_InputArray *)local_108);
  puVar8 = (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar8[1] = (long)((double)local_108 - 9.223372036854776e+18) & (long)(double)local_108 >> 0x3f |
              (long)(double)local_108;
  if ((long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    uVar17 = 0;
  }
  else {
    lVar24 = (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    dVar29 = 0.0;
    lVar22 = 0;
    do {
      dVar29 = dVar29 + (double)UF::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar22];
      lVar22 = lVar22 + 1;
    } while (lVar24 + (ulong)(lVar24 == 0) != lVar22);
    uVar17 = (long)(dVar29 - 9.223372036854776e+18) & (long)dVar29 >> 0x3f | (long)dVar29;
  }
  puVar8[2] = uVar17;
  MemMat<int>::GetImage((Mat_<int> *)local_108,(MemMat<int> *)local_2e0);
  cv::Mat::operator=(&((pDVar11->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                     ,(Mat *)local_108);
  cv::Mat::~Mat((Mat *)local_108);
  cv::Mat::~Mat(local_278);
  cv::Mat::~Mat((Mat *)(local_2e0 + 8));
  cv::Mat::~Mat(local_170);
  cv::Mat::~Mat((Mat *)(local_1d8 + 8));
  return;
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {

        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0); 

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        // First scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img(r,c)>0
#define CONDITION_P img(r-1,c-1)>0
#define CONDITION_Q img(r-1,c)>0
#define CONDITION_R img(r-1,c+1)>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels(r,c) = LabelsSolver::MemNewLabel(); // new label
#define ACTION_3 img_labels(r,c) = img_labels(r - 1, c - 1); // x <- p
#define ACTION_4 img_labels(r,c) = img_labels(r - 1, c); // x <- q
#define ACTION_5 img_labels(r,c) = img_labels(r - 1, c + 1); // x <- r
#define ACTION_6 img_labels(r,c) = img_labels(r, c - 1); // x <- s
#define ACTION_7 img_labels(r,c) = LabelsSolver::MemMerge(img_labels(r - 1, c - 1), img_labels(r - 1, c + 1)); // x <- p + r
#define ACTION_8 img_labels(r,c) = LabelsSolver::MemMerge(img_labels(r, c - 1), img_labels(r - 1, c + 1)); // x <- s + r

#define COLS w

        {
            int r = 0; 
#include "labeling_grana_2016_forest_0.inc.h"

        }

        for (int r = 1; r < h; ++r) {

#include "labeling_grana_2016_forest.inc.h"  

        }//End rows' for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r_i = 0; r_i < img_labels.rows; ++r_i) {
            for (int c_i = 0; c_i < img_labels.cols; ++c_i) {
                img_labels(r_i, c_i) = LabelsSolver::MemGetLabel(img_labels(r_i, c_i));
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage(); 

        LabelsSolver::MemDealloc();
    }